

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int pack_particle_slice(field3d<cellp> *cp,int left,int width,
                       vector<int,_std::allocator<int>_> *particle_numbers,
                       vector<particle,_std::allocator<particle>_> *particles)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  size_t p_index;
  size_t pn_index;
  size_t local_60;
  long local_58;
  vector<particle,_std::allocator<particle>_> *local_50;
  field3d<cellp> *local_48;
  long local_40;
  size_t local_38;
  
  local_60._0_4_ = 0;
  local_38 = 0;
  local_60 = 0;
  if (0 < width) {
    lVar4 = (long)left;
    local_58 = (long)(width + left);
    iVar1 = ny_global;
    local_50 = particles;
    local_48 = cp;
    do {
      if (0 < iVar1) {
        uVar2 = (ulong)(uint)nz_global;
        lVar5 = 0;
        local_40 = lVar4;
        do {
          if (0 < (int)uVar2) {
            lVar6 = 0;
            lVar3 = 0;
            do {
              pack_cell((cellp *)((long)&((cp->p)._M_t.
                                          super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>
                                          .super__Head_base<0UL,_cellp_***,_false>._M_head_impl
                                          [lVar4][lVar5]->pl).head + lVar6),particle_numbers,
                        &local_38,particles,&local_60);
              uVar2 = (ulong)nz_global;
              lVar3 = lVar3 + 1;
              lVar6 = lVar6 + 0x10;
              lVar4 = local_40;
              cp = local_48;
              particles = local_50;
              iVar1 = ny_global;
            } while (lVar3 < (long)uVar2);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar1);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < local_58);
  }
  return (int)local_60;
}

Assistant:

int pack_particle_slice(field3d<cellp> & cp, int left, int width, vector<int> & particle_numbers, vector<particle> & particles) {
    size_t pn_index = 0;
    size_t p_index = 0;

    for (int i=left; i<left+width; i++) {
        for (int j=0;j<ny_global;j++) {
            for (int k=0;k<nz_global;k++) {
                pack_cell(cp[i][j][k], particle_numbers, pn_index, particles, p_index);
            }
        }
    }

    return static_cast<int>(p_index);
}